

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

char * LocaleStringBuilder(char c,char *source,size_t source_capacity,char *dest,char *dest_end)

{
  char cVar1;
  char *dest_end_local;
  char *dest_local;
  size_t source_capacity_local;
  char *source_local;
  char c_local;
  
  if ((((dest != (char *)0x0) && (dest_end != (char *)0x0)) && (source != (char *)0x0)) &&
     (((source_capacity != 0 && (source[source_capacity - 1] == '\0')) && (dest < dest_end)))) {
    if (*source == '\0') {
      *dest = '\0';
      return dest;
    }
    dest_end_local = dest;
    source_capacity_local = (size_t)source;
    if ('\0' < c) {
      dest_end_local = dest + 1;
      *dest = c;
    }
    for (; dest_end_local < dest_end; dest_end_local = dest_end_local + 1) {
      cVar1 = *(char *)source_capacity_local;
      *dest_end_local = cVar1;
      if (cVar1 == '\0') {
        return dest_end_local;
      }
      source_capacity_local = source_capacity_local + 1;
    }
  }
  return (char *)0x0;
}

Assistant:

static char* LocaleStringBuilder(
  char c,
  const char* source,
  size_t source_capacity,
  char* dest,
  char* dest_end
  )
{
  if ( nullptr == dest || nullptr == dest_end || nullptr == source || source_capacity <= 0 )
    return nullptr;
  if ( 0 != source[source_capacity - 1])
    return nullptr;
  if (dest < dest_end)
  {
    if (0 == source[0])
    {
      *dest = 0;
      return dest;
    }
    if (c > 0 )
      *dest++ = c;
    while (dest < dest_end)
    {
      if (0 == (*dest = *source++))
        return dest;
      dest++;
    }
  }
  return nullptr;
}